

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-danger.c
# Opt level: O1

wchar_t borg_danger_one_kill
                  (wchar_t y,wchar_t x,wchar_t c,wchar_t i,_Bool average,_Bool full_damage)

{
  bitflag *flags;
  byte bVar1;
  ushort uVar2;
  wchar_t y_00;
  monster_blow *pmVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  char cVar10;
  chunk_conflict *pcVar11;
  monster_race *pmVar12;
  monster_race *pmVar13;
  _Bool _Var14;
  _Bool _Var15;
  bool bVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  wchar_t wVar22;
  int iVar23;
  wchar_t wVar24;
  loc lVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  short sVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  uint uVar45;
  int iVar46;
  long lVar47;
  int iVar48;
  wchar_t wVar49;
  borg_kill *pbVar50;
  ulong uVar51;
  borg_kill *pbVar52;
  long lVar53;
  wchar_t x_00;
  ulong uVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  monster_race *r_ptr;
  
  pmVar12 = r_info;
  uVar31 = (ulong)borg_kills[i].r_idx;
  if (uVar31 == 0) {
    return L'\0';
  }
  if ((int)(z_info->r_max - 1) <= (int)(uint)borg_kills[i].r_idx) {
    return L'd';
  }
  wVar24 = borg_kills[i].pos.x;
  y_00 = borg_kills[i].pos.y;
  if (0 < borg_tp_other_n) {
    lVar47 = 0;
    do {
      if (borg_tp_other_index[lVar47] == i) {
        return L'\0';
      }
      lVar47 = lVar47 + 1;
    } while ((ulong)(ushort)borg_tp_other_n + 1 != lVar47);
  }
  uVar17 = wVar24 - x;
  uVar45 = -uVar17;
  if (0 < (int)uVar17) {
    uVar45 = uVar17;
  }
  uVar18 = y_00 - y;
  uVar17 = -uVar18;
  if (0 < (int)uVar18) {
    uVar17 = uVar18;
  }
  if ((int)uVar17 < (int)uVar45) {
    uVar17 = uVar45;
  }
  uVar45 = 1;
  if (1 < (int)uVar17) {
    uVar45 = uVar17;
  }
  if (0x14 < uVar17) {
    return L'\0';
  }
  iVar19 = (uint)(borg_fighting_unique == L'\0') * 5 + 0x78;
  if (borg.trait[0x2c] < 0x87) {
    iVar19 = borg.trait[0x2c];
  }
  iVar27 = iVar19 + 10;
  if (!borg.temp.fast) {
    iVar27 = iVar19;
  }
  uVar18 = borg_kills[i].speed - 10;
  if (!borg_slow_spell) {
    uVar18 = (uint)borg_kills[i].speed;
  }
  uVar26 = uVar18;
  if ((borg.trait[0x1c] < 0x14) && (uVar26 = uVar18 + 3, borg.trait[0x69] == 0)) {
    uVar26 = uVar18;
  }
  uVar18 = (((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                   [(int)uVar26] *
            (("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
              [iVar27] + 99) /
            (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                  [iVar27])) / 10) * c;
  if (full_damage) {
    uVar18 = ((int)(uVar18 + 9) / 10) * 10;
  }
  pbVar50 = borg_kills + i;
  uVar26 = 10;
  if (10 < (int)uVar18) {
    uVar26 = uVar18;
  }
  sVar32 = (short)borg.trait[0x85] + 0x32;
  if (!borg.temp.shield) {
    sVar32 = (short)borg.trait[0x85];
  }
  bVar4 = true;
  if ((borg.temp.prot_from_evil) &&
     (_Var14 = flag_has_dbg(r_info[uVar31].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL"), _Var14)) {
    bVar4 = borg.trait[0x23] < pmVar12[uVar31].level;
  }
  uVar35 = 1000;
  if ((pbVar50->r_idx != 0) && ((int)(uint)pbVar50->r_idx < (int)(z_info->r_max - 1))) {
    if (z_info->mon_blows_max == 0) {
      uVar35 = 0;
    }
    else {
      iVar19 = (int)sVar32;
      if (0x95 < iVar19) {
        sVar32 = 0x96;
      }
      uVar54 = 0;
      lVar47 = 0x20;
      uVar35 = 0;
      do {
        pmVar3 = pmVar12[uVar31].blow;
        lVar38 = *(long *)((long)pmVar3 + lVar47 + -0x18);
        if (lVar38 == 0) goto LAB_002036fc;
        iVar27 = *(int *)((long)pmVar3 + lVar47 + -4);
        iVar43 = *(int *)((long)&pmVar3->next + lVar47);
        wVar20 = borg_mon_blow_effect((char *)**(undefined8 **)((long)pmVar3 + lVar47 + -0x10));
        iVar41 = 0;
        iVar42 = 0;
        switch(wVar20) {
        case L'\x01':
          iVar33 = iVar43 * iVar27;
          uVar34 = uVar35 + 400;
          if (iVar27 < 6) {
            uVar34 = uVar35;
          }
          if (2 < iVar43) {
            uVar34 = uVar35;
          }
          uVar35 = uVar34;
          iVar42 = 0x3c;
          if ((!bVar4) && (iVar42 = 0x3c, borg_attacking == false)) {
            iVar33 = iVar33 / 2;
          }
          break;
        case L'\x02':
          iVar33 = iVar43 * iVar27;
          iVar42 = 5;
          if ((borg.trait[0x49] != 0) || (borg.temp.res_pois != false)) break;
          iVar33 = iVar33 + 10;
LAB_002037b5:
          iVar42 = 5;
          if (bVar4) break;
LAB_0020333e:
          if (borg_attacking != false) break;
          goto LAB_002034dd;
        case L'\x03':
          iVar33 = iVar43 * iVar27;
          iVar42 = 0x14;
          if (borg.trait[0x54] == 0) {
            iVar33 = iVar33 + 500;
LAB_0020332e:
            if (!bVar4) goto LAB_0020333e;
          }
          break;
        case L'\x04':
          iVar33 = iVar43 * iVar27 + 0x14;
          iVar42 = 0xf;
          goto LAB_002034bd;
        case L'\x05':
          iVar33 = iVar43 * iVar27 + 0x32;
          if (4 < borg.trait[0x23]) {
            iVar33 = iVar43 * iVar27;
          }
          iVar42 = 5;
          if ((borg.trait[0x23] + adj_dex_safe[borg.trait[0x12]] < 100) &&
             (0xfffe79c2 < borg.trait[0x2d] - 0x186a1U)) {
LAB_002037b2:
            iVar33 = iVar33 + 5;
            goto LAB_002037b5;
          }
          break;
        case L'\x06':
          iVar33 = iVar43 * iVar27;
          iVar42 = 5;
          if (borg.trait[0x23] + adj_dex_safe[borg.trait[0x12]] < 100) {
LAB_0020332b:
            iVar42 = 5;
            iVar33 = iVar43 * iVar27 + 5;
            goto LAB_0020332e;
          }
          break;
        case L'\a':
          iVar33 = iVar43 * iVar27;
          iVar42 = 5;
          if (borg.trait[0x27] < 6) goto LAB_0020332b;
          break;
        case L'\b':
          iVar33 = iVar43 * iVar27;
          iVar42 = 5;
          if (borg_items[(ulong)z_info->pack_size + 5].timeout != 0) {
            _Var14 = flag_has_dbg(borg_items[(ulong)z_info->pack_size + 5].flags,5,0x15,
                                  "borg_items[INVEN_LIGHT].flags","OF_NO_FUEL");
            if (_Var14) {
              iVar42 = 5;
            }
            else {
              iVar42 = 5;
              if (borg.trait[0xd5] < 6) goto LAB_002037b2;
            }
          }
          break;
        case L'\t':
          if (borg.trait[0x41] != 0) goto switchD_00202d47_default;
          iVar43 = iVar43 * iVar27;
          if (borg.trait[0x48] != 0) {
            iVar43 = (iVar43 + 2) / 3;
          }
          if (borg.temp.res_acid == true) {
            iVar43 = (iVar43 + 2) / 3;
          }
          iVar33 = iVar43 + 200;
          goto joined_r0x00202d89;
        case L'\n':
          if (borg.trait[0x43] != 0) goto switchD_00202d47_default;
          iVar43 = iVar43 * iVar27;
          if (borg.trait[0x47] != 0) {
            iVar43 = (iVar43 + 2) / 3;
          }
          bVar57 = borg.temp.res_elec == true;
LAB_00203428:
          if (bVar57) {
            iVar43 = (iVar43 + 2) / 3;
          }
joined_r0x00202e59:
          iVar33 = iVar43 * 2;
          iVar42 = 10;
          if ((!bVar4) && (iVar33 = iVar43, iVar42 = 10, borg_attacking != false)) {
            iVar33 = iVar43 * 2;
          }
          break;
        case L'\v':
          if (borg.trait[0x40] == 0) {
            iVar43 = iVar43 * iVar27;
            if (borg.trait[0x45] != 0) {
              iVar43 = (iVar43 + 2) / 3;
            }
            bVar57 = borg.temp.res_fire == true;
            goto LAB_00203428;
          }
        default:
switchD_00202d47_default:
          iVar33 = 0;
          iVar42 = iVar41;
          break;
        case L'\f':
          if (borg.trait[0x42] == 0) {
            iVar43 = iVar43 * iVar27;
            if (borg.trait[0x46] != 0) {
              iVar43 = (iVar43 + 2) / 3;
            }
            bVar57 = borg.temp.res_acid == true;
            goto LAB_00203428;
          }
          goto switchD_00202d47_default;
        case L'\r':
          iVar33 = iVar43 * iVar27;
          iVar42 = 2;
          if (borg.trait[0x4d] == 0) {
            iVar27 = iVar33 + 10;
            iVar33 = iVar33 + 0x55;
LAB_00203300:
            if (borg.trait[0x19] != 1) {
              iVar33 = iVar27;
            }
            goto LAB_0020332e;
          }
          break;
        case L'\x0e':
          iVar33 = iVar43 * iVar27;
          iVar42 = 10;
          if (borg.trait[0x4e] == 0) {
            iVar27 = iVar33 + 200;
            iVar33 = iVar33 + 400;
            goto LAB_00203300;
          }
          break;
        case L'\x0f':
          iVar33 = iVar43 * iVar27;
          iVar42 = 10;
          iVar43 = iVar33;
          if (borg.trait[0x4a] == 0) goto joined_r0x00202e59;
          break;
        case L'\x10':
          iVar33 = iVar43 * iVar27;
          iVar42 = 2;
          if (borg.trait[0x56] == 0) {
            iVar33 = iVar33 + 200;
            goto LAB_0020332e;
          }
          break;
        case L'\x11':
          iVar33 = iVar43 * iVar27;
          if ((borg.trait[0x14] == 0) && (3 < borg.trait[10])) {
            _Var14 = borg_spell_legal(RESTORATION);
            if ((!_Var14) &&
               ((_Var14 = borg_spell_legal(REVITALIZE), !_Var14 &&
                (_Var14 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var14)))) {
              bVar57 = SBORROW4(borg.trait[10],10);
              iVar42 = borg.trait[10] + -10;
LAB_00203288:
              iVar33 = iVar43 * iVar27 + 0xfa;
              if (bVar57 == iVar42 < 0) {
                iVar33 = iVar43 * iVar27 + 0x96;
              }
LAB_00203774:
              if ((!bVar4) && (borg_attacking == false)) {
                iVar33 = iVar33 / 2;
                iVar42 = 0;
                break;
              }
            }
            goto LAB_0020378c;
          }
          break;
        case L'\x12':
          iVar33 = iVar43 * iVar27;
          if ((borg.trait[0x15] == 0) && (3 < borg.trait[0xb])) {
            _Var14 = borg_spell_legal(RESTORATION);
            if (((!_Var14) && (_Var14 = borg_spell_legal(REVITALIZE), !_Var14)) &&
               (_Var14 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var14)) {
              wVar20 = borg_spell_stat();
              iVar27 = iVar33 + 0x96;
              iVar33 = iVar33 + 200;
              if (wVar20 != L'\x01') {
                iVar33 = iVar27;
              }
              goto LAB_00203774;
            }
            goto LAB_0020378c;
          }
          break;
        case L'\x13':
          iVar33 = iVar43 * iVar27;
          if ((borg.trait[0x16] != 0) || (borg.trait[0xc] < 4)) break;
          _Var14 = borg_spell_legal(RESTORATION);
          if ((_Var14) || (_Var14 = borg_spell_legal(REVITALIZE), _Var14)) {
LAB_0020378c:
            iVar42 = 0;
            break;
          }
          wVar20 = borg_spell_stat();
          iVar27 = iVar33 + 0x96;
          iVar33 = iVar33 + 200;
          if (wVar20 != L'\x02') {
            iVar33 = iVar27;
          }
          if ((bVar4) || (borg_attacking != false)) goto LAB_0020378c;
          goto LAB_00203689;
        case L'\x14':
          iVar33 = iVar43 * iVar27;
          if ((borg.trait[0x17] == 0) && (3 < borg.trait[0xd])) {
            _Var14 = borg_spell_legal(RESTORATION);
            if ((_Var14) || (_Var14 = borg_spell_legal(REVITALIZE), _Var14)) goto LAB_0020378c;
            iVar27 = iVar33 + 0x96;
            iVar33 = iVar33 + 0xfa;
            if (9 < borg.trait[0xd]) {
              iVar33 = iVar27;
            }
            goto joined_r0x00202d89;
          }
          break;
        case L'\x15':
          iVar33 = iVar43 * iVar27;
          if ((borg.trait[0x18] == 0) && (3 < borg.trait[0xe])) {
            _Var14 = borg_spell_legal(RESTORATION);
            if ((!_Var14) &&
               ((_Var14 = borg_spell_legal(REVITALIZE), !_Var14 &&
                (_Var14 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var14)))) {
              bVar57 = SBORROW4(borg.trait[10],8);
              iVar42 = borg.trait[10] + -8;
              goto LAB_00203288;
            }
            goto LAB_0020378c;
          }
          break;
        case L'\x16':
          iVar33 = iVar43 * iVar27;
          iVar42 = 2;
          break;
        case L'\x17':
          iVar42 = (int)((ulong)((long)(iVar43 * iVar27 * (int)sVar32) * -0x10624dd3) >> 0x20);
          iVar33 = iVar43 * iVar27 + ((iVar42 >> 4) - (iVar42 >> 0x1f)) + 0x96;
          iVar42 = 0x3c;
LAB_002034bd:
          if ((!bVar4) && (borg_attacking == false)) {
LAB_002034dd:
            iVar33 = iVar33 / 2;
          }
          break;
        case L'\x18':
          iVar33 = iVar43 * iVar27;
          if ((borg.trait[0x55] == 0) && (borg.trait[0x23] != 0x32)) {
            _Var14 = borg_spell_legal(REMEMBRANCE);
            if ((!_Var14) &&
               ((_Var14 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var14 &&
                (_Var14 = borg_spell_legal(REVITALIZE), !_Var14)))) {
              iVar33 = iVar33 + 100;
              goto LAB_00203774;
            }
            goto LAB_0020378c;
          }
          break;
        case L'\x19':
          iVar33 = iVar43 * iVar27;
          if ((borg.trait[0x55] == 0) && (borg.trait[0x23] < 0x32)) {
            _Var14 = borg_spell_legal(REMEMBRANCE);
            if ((!_Var14) &&
               ((_Var14 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var14 &&
                (_Var14 = borg_spell_legal(REVITALIZE), !_Var14)))) {
              iVar33 = iVar33 + 0x96;
              goto LAB_00203774;
            }
            goto LAB_0020378c;
          }
          break;
        case L'\x1a':
          iVar33 = iVar43 * iVar27;
          if ((borg.trait[0x55] == 0) && (iVar42 = iVar41, borg.trait[0x23] < 0x32)) {
            _Var14 = borg_spell_legal(REMEMBRANCE);
            if ((!_Var14) &&
               ((_Var14 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var14 &&
                (_Var14 = borg_spell_legal(REVITALIZE), !_Var14)))) {
              iVar33 = iVar33 + 200;
              goto LAB_00203774;
            }
            goto LAB_0020378c;
          }
          break;
        case L'\x1b':
          iVar33 = iVar43 * iVar27;
          iVar42 = iVar41;
          if ((borg.trait[0x55] == 0) && (borg.trait[0x23] < 0x32)) {
            _Var14 = borg_spell_legal(REMEMBRANCE);
            if ((!_Var14) &&
               ((_Var14 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var14 &&
                (_Var14 = borg_spell_legal(REVITALIZE), !_Var14)))) {
              iVar33 = iVar33 + 0xfa;
              goto LAB_00203774;
            }
            goto LAB_0020378c;
          }
          break;
        case L'\x1c':
          iVar33 = iVar43 * iVar27 + 0xfa;
joined_r0x00202d89:
          iVar42 = 0;
          if ((!bVar4) && (iVar42 = 0, borg_attacking == false)) {
LAB_00203689:
            iVar33 = iVar33 / 2;
            iVar42 = 0;
          }
        }
        uVar34 = iVar33 - borg.trait[0x2f];
        if ((int)uVar34 < 1) {
          uVar34 = 0;
        }
        if (!full_damage) {
          if ((borg_fighting_unique == L'\0') &&
             (iVar27 = pmVar12[uVar31].level + iVar42,
             iVar27 == 0 || SCARRY4(pmVar12[uVar31].level,iVar42) != iVar27 < 0)) {
            iVar27 = -1;
          }
          else {
            iVar27 = iVar19 * -0x4b + 0x96 + (iVar42 + pmVar12[uVar31].level) * -3;
          }
          if (iVar27 < 6) {
            iVar27 = 5;
          }
          uVar34 = (iVar27 * uVar34) / 100;
        }
        uVar35 = uVar34 + uVar35;
LAB_002036fc:
        if (lVar38 == 0) break;
        uVar54 = uVar54 + 1;
        lVar47 = lVar47 + 0x30;
      } while (uVar54 < z_info->mon_blows_max);
    }
  }
  uVar34 = uVar35;
  if (25000 < borg_t) {
    uVar34 = (int)uVar35 / 5;
  }
  if (0x4b0 < borg.time_this_panel) {
    uVar34 = (int)uVar35 / 5;
  }
  uVar54 = (ulong)uVar34;
  flags = pmVar12[uVar31].flags;
  _Var14 = flag_has_dbg(flags,0xb,0x14,"r_ptr->flags","RF_NEVER_BLOW");
  _Var15 = flag_has_dbg(flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
  if (_Var14) {
    uVar54 = 0;
  }
  uVar35 = 0;
  if (!_Var15) {
    uVar35 = (uint)uVar54;
  }
  uVar51 = (ulong)uVar35;
  if (uVar17 < 2) {
    uVar51 = uVar54;
  }
  _Var14 = flag_has_dbg(flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
  if ((_Var14) && (borg.trait[0x23] < 0x14)) {
    uVar51 = (ulong)(uint)(((int)uVar51 * 0xf) / 10 + (int)uVar51);
  }
  if (((pmVar12[uVar31].friends != (monster_friends *)0x0) ||
      (pmVar12[uVar31].friends_base != (monster_friends_base *)0x0)) && (borg.trait[0x23] < 0x14)) {
    iVar19 = (int)uVar51;
    if (borg.trait[0x23] < 0xf) {
      iVar27 = iVar19 * 0x12;
    }
    else {
      iVar27 = iVar19 * 0xd;
    }
    uVar51 = (ulong)(uint)(iVar27 / 10 + iVar19);
  }
  wVar20 = (wchar_t)uVar51;
  if (pbVar50->awake == false) {
    wVar21 = (int)(uVar51 >> 0x1f) + wVar20 >> 1;
    if (borg.trait[0x23] < 0x19) {
      wVar21 = wVar20;
    }
    wVar20 = ((pmVar12[uVar31].sleep + L'\x05') * wVar21) / 100 + wVar21;
  }
  wVar21 = wVar20;
  if (((((uVar17 < 2 & borg_sleep_spell_ii & pbVar50->awake) == 1) &&
       (_Var14 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var14)) &&
      ((_Var14 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var14 &&
       ((int)pbVar50->level <= borg.trait[0x23] + -0xf)))) &&
     ((0x13 < borg.trait[0x23] || (wVar21 = L'\0', borg.trait[0x1c] / 2 <= borg.trait[0x1b])))) {
    wVar21 = wVar20 / 3;
  }
  wVar20 = wVar21;
  if (((((borg_sleep_spell == true) && (pbVar50->awake == true)) &&
       (_Var14 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var14)) &&
      ((_Var14 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var14 &&
       ((int)pbVar50->level <= borg.trait[0x23] + -0xf)))) &&
     ((0x13 < borg.trait[0x23] || (wVar20 = L'\0', borg.trait[0x1c] / 2 <= borg.trait[0x1b])))) {
    wVar20 = wVar21 / (int)(uVar45 + 2);
  }
  if ((borg_crush_spell == true) &&
     (((int)pbVar50->injury * (int)pbVar50->power) / 100 < borg.trait[0x23] * 4)) {
    wVar20 = L'\0';
  }
  wVar21 = wVar20 / 2;
  if (pbVar50->confused == false) {
    wVar21 = wVar20;
  }
  if (pbVar50->stunned == true) {
    wVar21 = (wVar21 * 10) / 0xd;
  }
  wVar20 = wVar21;
  if ((((borg_confuse_spell == true) && (((~pbVar50->awake | pbVar50->confused) & 1U) == 0)) &&
      (_Var14 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var14)) &&
     (((_Var14 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var14 &&
       ((int)pbVar50->level <= borg.trait[0x23] + -0xf)) &&
      ((0x13 < borg.trait[0x23] || (wVar20 = L'\0', borg.trait[0x1c] / 2 <= borg.trait[0x1b])))))) {
    wVar20 = wVar21 / (int)(uVar45 + 2);
  }
  wVar21 = L'\0';
  if (borg_fear_mon_spell == false) {
    wVar21 = wVar20;
  }
  wVar20 = wVar21;
  if (((1 < uVar17) && (10 < (int)uVar18)) &&
     (_Var14 = flag_has_dbg(flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"), !_Var14)) {
    lVar47 = 0;
    wVar20 = L'\0';
    do {
      pcVar11 = cave;
      lVar38 = (long)ddy_ddd[lVar47] + (long)y_00;
      lVar53 = (long)ddx_ddd[lVar47] + (long)wVar24;
      x_00 = (wchar_t)lVar53;
      wVar49 = (wchar_t)lVar38;
      lVar25 = (loc)loc(x_00,wVar49);
      _Var14 = square_in_bounds_fully(pcVar11,lVar25);
      if ((_Var14) && (borg_grids[lVar38][lVar53].kill == '\0')) {
        bVar1 = borg_grids[lVar38][lVar53].feat;
        if (bVar1 - 0x10 < 6) {
          _Var14 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
          if ((_Var14) && (wVar22 = borg_distance(wVar49,x_00,y,x), wVar22 == L'\x01')) {
            wVar20 = wVar21;
          }
          _Var14 = flag_has_dbg(flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
          if ((_Var14) && (wVar22 = borg_distance(wVar49,x_00,y,x), wVar22 == L'\x01')) {
            wVar20 = wVar21;
          }
        }
        else if ((bVar1 == 2) || (bVar1 == 0x16)) goto LAB_00203d89;
        wVar22 = borg_distance(wVar49,x_00,y,x);
        if ((wVar22 < L'\x02') && (_Var14 = borg_cave_floor_bold(wVar49,x_00), _Var14)) {
          wVar20 = (uVar26 / (uVar45 * 10)) * wVar21;
        }
      }
LAB_00203d89:
      lVar47 = lVar47 + 1;
    } while (lVar47 != 8);
  }
  pbVar52 = borg_kills;
  pmVar13 = r_info;
  if (10 < (int)uVar18 && uVar17 < 2) {
    wVar20 = (wVar20 * uVar26) / 10;
  }
  bVar4 = false;
  wVar21 = wVar20;
  if ((int)uVar18 < 0xb) {
    wVar21 = L'\0';
  }
  if (uVar17 < 2) {
    wVar21 = wVar20;
  }
  uVar2 = borg_kills[i].r_idx;
  bVar57 = true;
  if (borg.temp.prot_from_evil == true) {
    _Var14 = flag_has_dbg(r_info[uVar2].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
    if (_Var14) {
      bVar57 = borg.trait[0x23] < pmVar13[uVar2].level;
      bVar4 = pmVar13[uVar2].level <= borg.trait[0x23];
    }
    else {
      bVar4 = false;
    }
  }
  pbVar52 = pbVar52 + i;
  bVar9 = true;
  if (borg_on_glyph == false) {
    if ((long)track_glyph.num < 1) {
      bVar9 = false;
    }
    else {
      lVar47 = 0;
      bVar9 = false;
      do {
        if ((track_glyph.y[lVar47] == y) && (track_glyph.x[lVar47] == x)) {
          bVar9 = true;
        }
        lVar47 = lVar47 + 1;
      } while (track_glyph.num != lVar47);
    }
  }
  uVar35 = 1000;
  if ((pbVar52->r_idx != 0) && ((int)(uint)pbVar52->r_idx < (int)(z_info->r_max - 1))) {
    if (pbVar52->ranged_attack == '\0') {
      uVar35 = 0;
    }
    else {
      sVar32 = pbVar52->power;
      iVar19 = ((int)sVar32 / 3 + ((int)sVar32 >> 0x1f)) - (int)((long)sVar32 * 0x55555556 >> 0x3f);
      iVar27 = 0x640;
      if (iVar19 < 0x640) {
        iVar27 = iVar19;
      }
      iVar43 = ((int)sVar32 / 6 + ((int)sVar32 >> 0x1f)) - (int)((long)sVar32 * 0x2aaaaaab >> 0x3f);
      iVar42 = 200;
      if (iVar43 < 200) {
        iVar42 = iVar43;
      }
      iVar41 = 0x96;
      if (iVar43 < 0x96) {
        iVar41 = iVar43;
      }
      iVar33 = 500;
      if (iVar43 < 500) {
        iVar33 = iVar43;
      }
      iVar7 = (iVar33 * 6) / 9;
      iVar44 = 200;
      if (iVar19 < 200) {
        iVar44 = iVar19;
      }
      iVar46 = 0x96;
      if (iVar19 < 0x96) {
        iVar46 = iVar19;
      }
      iVar29 = 400;
      if (iVar43 < 400) {
        iVar29 = iVar43;
      }
      iVar8 = (iVar33 * 6) / 10;
      if (599 < iVar43) {
        iVar43 = 600;
      }
      iVar5 = (iVar33 * 2) / 3;
      if (799 < iVar19) {
        iVar19 = 800;
      }
      iVar6 = (iVar27 + 2) / 3;
      iVar39 = 0;
      if (uVar17 < 4) {
        iVar39 = 100;
      }
      iVar30 = 100;
      if (2 < uVar17) {
        iVar30 = 0;
      }
      iVar48 = 1;
      uVar54 = 0;
      bVar16 = false;
      iVar40 = 0;
      uVar34 = 0;
      do {
        iVar36 = iVar5;
        cVar10 = borg.temp.res_cold;
        switch(pbVar52->spell[uVar54]) {
        case '\x01':
        case 'H':
          iVar23 = 5;
          goto LAB_002059e7;
        case '\x02':
          iVar23 = 0;
          iVar36 = iVar30;
          break;
        case '\x03':
          iVar23 = 0;
          iVar36 = iVar39;
          break;
        case '\x04':
          wVar20 = pmVar13[uVar2].spell_power;
          wVar49 = wVar20 + L'\a';
          if (L'\xffffffff' < wVar20) {
            wVar49 = wVar20;
          }
          iVar36 = (wVar49 >> 3) * 5 + 5;
          goto LAB_00205dad;
        case '\x05':
          wVar20 = pmVar13[uVar2].spell_power;
          wVar49 = wVar20 + L'\a';
          if (L'\xffffffff' < wVar20) {
            wVar49 = wVar20;
          }
          iVar36 = (wVar49 >> 3) * 6 + 6;
          goto LAB_00205dad;
        case '\x06':
          wVar20 = pmVar13[uVar2].spell_power;
          wVar49 = wVar20 + L'\a';
          if (L'\xffffffff' < wVar20) {
            wVar49 = wVar20;
          }
          iVar36 = ((wVar49 & 0xfffffff8U) - (wVar49 >> 3)) + 7;
          goto LAB_00205dad;
        case '\a':
          if (borg.trait[0x41] != 0) goto switchD_00204167_caseD_1b;
          iVar36 = iVar6;
          if (borg.trait[0x48] == 0) {
            iVar36 = iVar27;
          }
          iVar28 = 0x28;
          iVar23 = 0x28;
          if (borg.temp.res_acid != true) break;
LAB_00205e66:
          iVar23 = iVar28;
          iVar36 = (iVar36 + 2) / 3;
          break;
        case '\b':
          if (borg.trait[0x43] != 0) goto switchD_00204167_caseD_1b;
          iVar36 = iVar6;
          if (borg.trait[0x47] == 0) {
            iVar36 = iVar27;
          }
          iVar28 = 0x14;
          iVar23 = 0x14;
          cVar10 = borg.temp.res_elec;
joined_r0x00205e60:
          if (cVar10 == '\x01') goto LAB_00205e66;
          break;
        case '\t':
          if (borg.trait[0x40] == 0) {
            iVar36 = iVar6;
            if (borg.trait[0x45] == 0) {
              iVar36 = iVar27;
            }
            iVar28 = 0x28;
            iVar23 = 0x28;
            cVar10 = borg.temp.res_fire;
            goto joined_r0x00205e60;
          }
          goto switchD_00204167_caseD_1b;
        case '\n':
          if (borg.trait[0x42] == 0) {
            iVar36 = iVar6;
            if (borg.trait[0x46] == 0) {
              iVar36 = iVar27;
            }
            iVar28 = 0x14;
            iVar23 = 0x14;
            goto joined_r0x00205e60;
          }
          goto switchD_00204167_caseD_1b;
        case '\v':
          iVar28 = borg.trait[0x49];
          iVar36 = (iVar19 + 2) / 3;
          if (iVar28 == 0) {
            iVar36 = iVar19;
          }
          goto LAB_00205c15;
        case '\f':
          bVar55 = borg.trait[0x52] == 0;
          iVar23 = 0x7d;
          if (!bVar55) {
            iVar23 = 0;
          }
          goto LAB_00205586;
        case '\r':
          if (borg.trait[0x4b] == 0) {
            if (borg.trait[0x4d] == 0) {
              iVar23 = 0x14;
              iVar36 = iVar33;
              if (borg.trait[0x19] == 1) {
                iVar23 = 0x28;
              }
            }
            else {
              iVar23 = 0;
              iVar36 = iVar33;
            }
          }
          else {
            iVar23 = 0;
          }
          break;
        case '\x0e':
          iVar23 = iVar33;
          if (borg.trait[0x4c] != 0) goto LAB_00205dad;
          goto LAB_00205276;
        case '\x0f':
          iVar36 = (iVar33 * 5) / 9;
          if (borg.trait[0x4f] == 0) {
            iVar23 = iVar33 + 500;
            if (borg.trait[0x75] == 0) {
              iVar23 = iVar33;
            }
            iVar28 = borg.trait[0x76];
            iVar36 = iVar23 + 1000;
LAB_00205c73:
            if (iVar28 == 0) {
              iVar36 = iVar23;
            }
            goto LAB_00205c77;
          }
          goto LAB_00205dad;
        case '\x10':
          bVar55 = borg.trait[0x53] == 0;
          iVar23 = 100;
          if (bVar55) {
            iVar23 = 300;
          }
LAB_00205586:
          iVar36 = (iVar43 * 6) / 9;
          if (bVar55) {
            iVar36 = iVar43;
          }
          break;
        case '\x11':
          bVar55 = borg.trait[0x54] == 0;
          iVar23 = 500;
          iVar36 = iVar8;
          if (!bVar55) {
            iVar23 = 0;
          }
          goto LAB_002054e9;
        case '\x12':
          iVar23 = 0;
          iVar36 = (iVar29 * 6) / 10;
          if (borg.trait[0x51] == 0) {
            iVar23 = 100;
            iVar36 = iVar29;
          }
          break;
        case '\x13':
          iVar23 = 0xfa;
          iVar36 = iVar46;
          break;
        case '\x14':
          iVar23 = 100;
          iVar36 = iVar42;
          break;
        case '\x15':
          iVar23 = 100;
          iVar36 = iVar44;
          if (borg.trait[0x4f] == 0) {
            iVar28 = iVar44 + 500;
            if (borg.trait[0x75] == 0) {
              iVar28 = iVar44;
            }
            iVar23 = 100;
            iVar36 = iVar28 + 1000;
            if (borg.trait[0x76] == 0) {
              iVar36 = iVar28;
            }
          }
          break;
        case '\x16':
          bVar55 = borg.trait[0x50] == 0;
          iVar23 = 0x32;
          iVar36 = iVar7;
          if (!bVar55) {
            iVar23 = 0;
          }
LAB_002054e9:
          if (bVar55) {
            iVar36 = iVar33;
          }
          break;
        case '\x17':
          if (borg.trait[0x4f] == 0) {
            iVar23 = iVar41 + 500;
            if (borg.trait[0x75] == 0) {
              iVar23 = iVar41;
            }
            iVar36 = iVar23 + 1000;
            if (borg.trait[0x76] == 0) {
              iVar36 = iVar23;
            }
            iVar23 = 100;
          }
          else {
            iVar23 = 0;
            iVar36 = iVar41;
          }
          break;
        case '\x18':
          if (borg.trait[0x4f] == 0) {
            iVar23 = iVar42 + 100;
            if (borg.trait[0x75] == 0) {
              iVar23 = iVar42;
            }
            iVar28 = borg.trait[0x76];
            iVar36 = iVar23 + 500;
            goto LAB_00205c73;
          }
          iVar23 = 0;
          iVar36 = iVar42;
          break;
        case '\x19':
          iVar23 = 0;
          iVar36 = iVar27;
          break;
        case '\x1a':
          iVar36 = ((uint)((ulong)((long)pmVar13[uVar2].spell_power * 0x92492493) >> 0x22) -
                   (pmVar13[uVar2].spell_power >> 0x1f)) * 0xc;
          goto LAB_002056d9;
        default:
          goto switchD_00204167_caseD_1b;
        case '\x1c':
          if (borg.trait[0x41] == 0) {
            if (borg.trait[0x48] == 0) {
              iVar36 = pmVar13[uVar2].spell_power * 3 + 0xf;
            }
            else {
              iVar36 = pmVar13[uVar2].spell_power * 3 + 0x11;
LAB_00205694:
              iVar36 = iVar36 / 3;
            }
LAB_00205e29:
            iVar28 = 0x28;
            iVar23 = 0x28;
            cVar10 = borg.temp.res_acid;
            goto joined_r0x00205e60;
          }
          goto switchD_00204167_caseD_1b;
        case '\x1d':
          if (borg.trait[0x43] == 0) {
            iVar36 = (pmVar13[uVar2].spell_power * 3) / 2;
            if (borg.trait[0x47] == 0) {
              iVar36 = iVar36 + 8;
            }
            else {
              iVar36 = (iVar36 + 10) / 3;
            }
LAB_00205d0d:
            iVar28 = 0x14;
            iVar23 = 0x14;
            cVar10 = borg.temp.res_elec;
            goto joined_r0x00205e60;
          }
          goto switchD_00204167_caseD_1b;
        case '\x1e':
          if (borg.trait[0x40] == 0) {
            iVar36 = (pmVar13[uVar2].spell_power * 7) / 2;
            if (borg.trait[0x45] == 0) {
              iVar36 = iVar36 + 10;
            }
            else {
              iVar36 = (iVar36 + 0xc) / 3;
            }
LAB_00205d63:
            iVar28 = 0x28;
            iVar23 = 0x28;
            cVar10 = borg.temp.res_fire;
            goto joined_r0x00205e60;
          }
          goto switchD_00204167_caseD_1b;
        case '\x1f':
          if (borg.trait[0x42] == 0) {
            iVar36 = (pmVar13[uVar2].spell_power * 3) / 2;
            if (borg.trait[0x46] == 0) {
              iVar36 = iVar36 + 10;
            }
            else {
              iVar36 = (iVar36 + 0xc) / 3;
            }
LAB_00205e55:
            iVar28 = 0x14;
            iVar23 = 0x14;
            goto joined_r0x00205e60;
          }
          goto switchD_00204167_caseD_1b;
        case ' ':
          uVar35 = (pmVar13[uVar2].spell_power - (pmVar13[uVar2].spell_power >> 0x1f)) * 2 &
                   0xfffffffc;
          iVar28 = borg.trait[0x49];
          if (iVar28 == 0) {
            iVar36 = uVar35 + 0xc;
          }
          else {
            iVar36 = (int)(uVar35 + 0xe) / 3;
          }
LAB_00205c15:
          if (borg.temp.res_pois == true) {
            iVar36 = (iVar36 + 2) / 3;
          }
          iVar23 = 0x14;
          if (iVar28 != 0) {
            iVar23 = 0;
          }
          if (borg.temp.res_pois != false) {
            iVar23 = 0;
          }
          break;
        case '!':
          iVar36 = (pmVar13[uVar2].spell_power * 3) / 2 + 10;
          if (borg.trait[0x50] != 0) {
            iVar36 = iVar36 * 6;
            uVar37 = iVar36 >> 0x1f;
            uVar35 = uVar37 >> 0x1f;
            iVar36 = iVar36 / 9 + uVar37;
LAB_00205daa:
            iVar36 = iVar36 + uVar35;
            goto LAB_00205dad;
          }
          iVar23 = 0x14;
          break;
        case '\"':
          iVar36 = (pmVar13[uVar2].spell_power * 8 + 200) * 3 >> 3;
          if (borg.trait[0x52] == 0) {
            iVar36 = pmVar13[uVar2].spell_power * 4 + 100;
          }
          iVar23 = 0xfa;
          if (borg.trait[0x52] != 0) {
            iVar23 = 0;
          }
          break;
        case '#':
          iVar36 = (pmVar13[uVar2].spell_power * 5) / 2 + 0x32;
          if (borg.trait[0x4f] != 0) goto LAB_00205dad;
          iVar28 = 500;
          if (borg.trait[0x75] == 0) {
            iVar28 = 0;
          }
          iVar23 = iVar28 + 1000;
          if (borg.trait[0x76] == 0) {
            iVar23 = iVar28;
          }
          if (borg.trait[0x4e] == 0) {
            iVar28 = iVar23 + 0x32;
            iVar23 = iVar23 + 0x46;
LAB_0020555b:
            if (borg.trait[0x19] != 1) {
              iVar23 = iVar28;
            }
          }
          break;
        case '$':
          iVar36 = pmVar13[uVar2].spell_power * 5 + 100;
          goto LAB_00205c77;
        case '%':
          iVar36 = (pmVar13[uVar2].spell_power * 3) / 2;
          iVar36 = ((iVar36 - (iVar36 + 1 >> 0x1f)) + 1 >> 1) + 10;
LAB_00205c77:
          iVar23 = 0x32;
          break;
        case '&':
          iVar23 = pmVar13[uVar2].spell_power * 4 + 100;
          iVar36 = borg.trait[0x4c];
          goto LAB_0020524b;
        case '\'':
          iVar23 = (pmVar13[uVar2].spell_power * 3) / 2 + 10;
          iVar36 = borg.trait[0x4b];
LAB_0020524b:
          if (iVar36 == 0) {
LAB_00205276:
            iVar36 = iVar23;
            if (borg.trait[0x4d] == 0) {
              iVar23 = 0x14;
              if (borg.trait[0x19] == 1) {
                iVar23 = 0x28;
              }
              break;
            }
          }
          else {
            iVar36 = (iVar23 * 6) / 9;
          }
          goto LAB_00205dad;
        case '(':
          iVar36 = pmVar13[uVar2].spell_power * 5 + 0x46;
          if (borg.trait[0x4f] != 0) goto LAB_00205dad;
          iVar28 = 500;
          if (borg.trait[0x75] == 0) {
            iVar28 = 0;
          }
          iVar23 = iVar28 + 1000;
          if (borg.trait[0x76] == 0) {
            iVar23 = iVar28;
          }
          break;
        case ')':
          iVar23 = 100;
          if (borg.trait[0x1f] == 0) {
            iVar23 = 0;
          }
          goto LAB_002059e7;
        case '*':
          if (99 < borg.trait[0x39]) goto switchD_00204167_caseD_1b;
          iVar36 = pmVar13[uVar2].spell_power / 2 + 1;
          goto LAB_00205dad;
        case '+':
          iVar36 = borg.trait[0x39] * -2 + 200;
          iVar23 = 0;
          if (0 < iVar36) {
            iVar23 = iVar36;
          }
          iVar36 = 0x60;
          break;
        case ',':
          if (borg.trait[0x39] < 100) {
            iVar36 = (0x78 - borg.trait[0x39]) * (pmVar13[uVar2].spell_power / 3) * 10;
            uVar37 = iVar36 >> 0x1f;
            uVar35 = uVar37 >> 0x1f;
            iVar36 = iVar36 / 100 + uVar37;
            goto LAB_00205daa;
          }
          goto switchD_00204167_caseD_1b;
        case '-':
          bVar16 = true;
          if (borg.trait[0x41] == 0) {
            iVar36 = pmVar13[uVar2].spell_power >> 0x1f;
            iVar23 = pmVar13[uVar2].spell_power / 3 + iVar36;
            if (borg.trait[0x48] != 0) {
              iVar36 = (iVar23 - iVar36) + 0x3a;
              goto LAB_00205694;
            }
            iVar36 = (iVar23 - iVar36) + 0x38;
            goto LAB_00205e29;
          }
          goto switchD_00204167_caseD_1b;
        case '.':
          if (borg.trait[0x43] == 0) {
            iVar36 = pmVar13[uVar2].spell_power >> 0x1f;
            iVar23 = pmVar13[uVar2].spell_power / 3 + iVar36;
            if (borg.trait[0x47] == 0) {
              iVar36 = (iVar23 - iVar36) + 0x20;
            }
            else {
              iVar36 = ((iVar23 - iVar36) + 0x22) / 3;
            }
            bVar16 = true;
            goto LAB_00205d0d;
          }
          goto switchD_00204167_caseD_1b;
        case '/':
          if (borg.trait[0x40] == 0) {
            iVar36 = pmVar13[uVar2].spell_power >> 0x1f;
            iVar23 = pmVar13[uVar2].spell_power / 3 + iVar36;
            if (borg.trait[0x45] == 0) {
              iVar36 = (iVar23 - iVar36) + 0x48;
            }
            else {
              iVar36 = ((iVar23 - iVar36) + 0x4a) / 3;
            }
            bVar16 = true;
            goto LAB_00205d63;
          }
          goto switchD_00204167_caseD_1b;
        case '0':
          if (borg.trait[0x42] == 0) {
            iVar36 = pmVar13[uVar2].spell_power >> 0x1f;
            iVar23 = pmVar13[uVar2].spell_power / 3 + iVar36;
            if (borg.trait[0x46] == 0) {
              iVar36 = (iVar23 - iVar36) + 0x30;
            }
            else {
              iVar36 = ((iVar23 - iVar36) + 0x32) / 3;
            }
            bVar16 = true;
            goto LAB_00205e55;
          }
          goto switchD_00204167_caseD_1b;
        case '1':
          if (borg.trait[0x44] != 0) goto switchD_00204167_caseD_1b;
          iVar36 = pmVar13[uVar2].spell_power >> 0x1f;
          iVar23 = pmVar13[uVar2].spell_power / 3 + iVar36;
          cVar10 = borg.temp.res_pois;
          if (borg.trait[0x49] == 0) {
            iVar36 = (iVar23 - iVar36) + 0x48;
          }
          else {
            iVar36 = ((iVar23 - iVar36) + 0x4a) / 3;
          }
joined_r0x00205d8f:
          bVar16 = true;
          if (cVar10 == '\x01') {
            bVar16 = true;
            uVar37 = iVar36 + 2;
            uVar35 = uVar37 >> 0x1f;
            iVar36 = (int)uVar37 / 3 + ((int)uVar37 >> 0x1f);
            goto LAB_00205daa;
          }
          goto LAB_00205dad;
        case '2':
          iVar36 = (pmVar13[uVar2].spell_power * 3) / 2 + 0x4b;
          bVar16 = true;
          if (borg.trait[0x52] != 0) {
LAB_002047f6:
            bVar16 = true;
            iVar23 = iVar36 * 6 + 7;
            if (-1 < iVar36 * 6) {
              iVar23 = iVar36 * 6;
            }
            iVar36 = iVar23 >> 3;
            goto LAB_00205dad;
          }
          iVar23 = 200;
          break;
        case '3':
          iVar36 = pmVar13[uVar2].spell_power + L'd';
          bVar16 = true;
          if (borg.trait[0x4f] != 0) goto LAB_00205dad;
          iVar28 = 500;
          if (borg.trait[0x75] == 0) {
            iVar28 = 0;
          }
          iVar23 = iVar28 + 1000;
          if (borg.trait[0x76] == 0) {
            iVar23 = iVar28;
          }
          if (borg.trait[0x4e] == 0) {
            iVar28 = iVar23 + 0x14;
            iVar23 = iVar23 + 0x28;
            goto LAB_0020555b;
          }
          break;
        case '4':
          bVar16 = true;
          iVar23 = 0x32;
          iVar36 = (pmVar13[uVar2].spell_power * 5) / 2 + 0x32;
          break;
        case '5':
          iVar36 = pmVar13[uVar2].spell_power + L'B';
          bVar16 = true;
          if (borg.trait[0x4f] == 0) {
            iVar23 = pmVar13[uVar2].spell_power + L'ȶ';
            if (borg.trait[0x75] == 0) {
              iVar23 = iVar36;
            }
            iVar36 = iVar23 + 1000;
            if (borg.trait[0x76] == 0) {
              iVar36 = iVar23;
            }
          }
          goto LAB_00205dad;
        case '6':
          iVar36 = pmVar13[uVar2].spell_power + L'$';
          iVar23 = 0x14;
          bVar16 = true;
          if (borg.trait[0x4f] == 0) {
            iVar28 = pmVar13[uVar2].spell_power + L'V';
            if (borg.trait[0x75] == 0) {
              iVar28 = iVar36;
            }
            iVar36 = iVar28 + 1000;
            if (borg.trait[0x76] == 0) {
              iVar36 = iVar28;
            }
          }
          break;
        case '7':
          iVar36 = pmVar13[uVar2].spell_power / 3;
LAB_002056d9:
          bVar16 = true;
          iVar36 = iVar36 + 0xc;
          goto LAB_00205dad;
        case '8':
          if (borg.trait[0x43] == 0) {
            cVar10 = borg.temp.res_elec;
            if (borg.trait[0x47] == 0) {
              iVar36 = pmVar13[uVar2].spell_power * 2 + 0x37;
            }
            else {
              iVar36 = (pmVar13[uVar2].spell_power * 2 + 0x39) / 3;
            }
            goto joined_r0x00205d8f;
          }
          goto switchD_00204167_caseD_1b;
        case '9':
          iVar36 = pmVar13[uVar2].spell_power * 2 + 0x37;
          bVar16 = true;
          if (borg.trait[0x52] != 0) goto LAB_002047f6;
LAB_00205dad:
          iVar23 = 0;
          break;
        case ':':
          goto LAB_002059ef;
        case ';':
          iVar36 = borg.trait[0x4d];
          goto joined_r0x002059e3;
        case '<':
          iVar36 = borg.trait[0x4e];
joined_r0x002059e3:
          if (iVar36 != 0) goto switchD_00204167_caseD_1b;
LAB_002059ef:
          bVar56 = SBORROW4(borg.trait[0x39],100);
          bVar55 = borg.trait[0x39] + -100 < 0;
          iVar23 = 10;
LAB_002059fe:
          iVar36 = 0;
          if (bVar56 == bVar55) {
            iVar23 = 0;
          }
          break;
        case '=':
          if (borg.trait[0x56] != 0) goto switchD_00204167_caseD_1b;
          iVar23 = (uint)(borg.trait[0x39] < 100) * 5;
          goto LAB_002059e7;
        case '>':
          if (borg.trait[0x56] == 0) {
            bVar56 = SBORROW4(borg.trait[0x39],100);
            bVar55 = borg.trait[0x39] + -100 < 0;
            iVar23 = 0x96;
            goto LAB_002059fe;
          }
switchD_00204167_caseD_1b:
          iVar23 = 0;
LAB_002059e7:
          iVar36 = 0;
          break;
        case '?':
        case '@':
        case 'C':
        case 'F':
          iVar23 = 10;
          goto LAB_002059e7;
        case 'D':
        case 'E':
          iVar23 = 0x14;
          goto LAB_002059e7;
        case 'G':
          bVar56 = SBORROW4(borg.trait[0x39],100);
          bVar55 = borg.trait[0x39] + -100 < 0;
          iVar23 = 0x32;
          goto LAB_002059fe;
        case 'I':
          iVar23 = 0x32;
          goto LAB_002059e7;
        case 'J':
          if (99 < borg.trait[0x39]) goto switchD_00204167_caseD_1b;
          iVar23 = 0x1e;
          if (borg.trait[0x1e] < 0xf) {
            iVar23 = 500;
          }
          goto LAB_002059e7;
        case 'K':
          iVar23 = 200;
          goto LAB_002059e7;
        case 'L':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_00204577;
                }
                iVar48 = 1000;
              }
LAB_00204577:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          goto LAB_0020545e;
        case 'M':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_00204aae;
                }
                iVar48 = 1000;
              }
LAB_00204aae:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          goto LAB_002058d8;
        case 'N':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_0020537d;
                }
                iVar48 = 1000;
              }
LAB_0020537d:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          if (((bVar9 || bVar4) || (borg_create_door != false)) || (borg_fighting_unique != L'\0'))
          goto switchD_00204167_caseD_1b;
          iVar23 = (pmVar13[uVar2].spell_power * 5) / iVar48;
          goto LAB_002059e7;
        case 'O':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_00204608;
                }
                iVar48 = 1000;
              }
LAB_00204608:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          iVar23 = 0;
          if (((bVar9 || bVar4) || (iVar23 = 0, borg_create_door != false)) ||
             (iVar23 = 0, borg_fighting_unique != L'\0')) goto LAB_00205ad5;
          iVar23 = pmVar13[uVar2].spell_power * 7;
          goto LAB_00205acf;
        case 'P':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_00205a7f;
                }
                iVar48 = 1000;
              }
LAB_00205a7f:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          goto LAB_00205a93;
        case 'Q':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_00204455;
                }
                iVar48 = 1000;
              }
LAB_00204455:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          goto LAB_00205a93;
        case 'R':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_00204d38;
                }
                iVar48 = 1000;
              }
LAB_00204d38:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
LAB_00205a93:
          iVar23 = 0;
          if (((!bVar9 && !bVar4) && (iVar23 = 0, borg_create_door == false)) &&
             (iVar23 = 0, borg_fighting_unique == L'\0')) {
            iVar23 = pmVar13[uVar2].spell_power * 5;
LAB_00205acf:
            iVar23 = iVar23 / iVar48;
          }
LAB_00205ad5:
          _Var14 = flag_has_dbg(r_info->flags,0xb,1,"r_info->flags","RF_UNIQUE");
          iVar36 = 0;
          if (_Var14) {
            iVar23 = (iVar23 * 0x4b) / 100;
          }
          break;
        case 'S':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_002042dc;
                }
                iVar48 = 1000;
              }
LAB_002042dc:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          if (!bVar57) goto LAB_002058f9;
          if (((bVar9) || (borg_create_door != false)) || (borg_fighting_unique != L'\0')) {
            wVar20 = pmVar13[uVar2].spell_power * 2;
          }
          else {
            wVar20 = pmVar13[uVar2].spell_power * 5;
          }
          goto LAB_00205901;
        case 'T':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_0020438d;
                }
                iVar48 = 1000;
              }
LAB_0020438d:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          if ((bool)(borg_fighting_unique != L'\0' | bVar4)) goto LAB_002058f9;
          if ((bVar9) || (borg_create_door == true)) goto LAB_00205474;
          goto LAB_00205b46;
        case 'U':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_0020496a;
                }
                iVar48 = 1000;
              }
LAB_0020496a:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          goto LAB_0020545e;
        case 'V':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_0020544a;
                }
                iVar48 = 1000;
              }
LAB_0020544a:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          goto LAB_0020545e;
        case 'W':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_002044e6;
                }
                iVar48 = 1000;
              }
LAB_002044e6:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
LAB_0020545e:
          if (bVar57) {
            if (((bVar9) || (borg_create_door != false)) || (borg_fighting_unique != L'\0')) {
LAB_00205474:
              wVar20 = pmVar13[uVar2].spell_power;
LAB_002058f4:
              wVar20 = wVar20 * 3;
            }
            else {
LAB_00205b46:
              wVar20 = pmVar13[uVar2].spell_power * 7;
            }
          }
          else {
LAB_002058f9:
            wVar20 = pmVar13[uVar2].spell_power;
          }
LAB_00205901:
          iVar23 = wVar20 / iVar48;
          _Var14 = flag_has_dbg(r_info->flags,0xb,1,"r_info->flags","RF_UNIQUE");
          if (_Var14) {
            iVar23 = (iVar23 * 0x4b) / 100;
          }
          goto LAB_002059e7;
        case 'X':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_0020488c;
                }
                iVar48 = 1000;
              }
LAB_0020488c:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          goto LAB_002058d8;
        case 'Y':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_002041ff;
                }
                iVar48 = 1000;
              }
LAB_002041ff:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          iVar23 = 0;
          if (bVar57) {
            iVar23 = 6;
            if (!bVar9) {
              iVar23 = 0xc;
              if (borg_fighting_unique != L'\0') {
                iVar23 = 6;
              }
              if (borg_create_door != false) {
                iVar23 = 6;
              }
            }
            iVar23 = iVar23 * pmVar13[uVar2].spell_power;
            goto LAB_00205acf;
          }
          goto LAB_00205ad5;
        case 'Z':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_002058c4;
                }
                iVar48 = 1000;
              }
LAB_002058c4:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
LAB_002058d8:
          if (!bVar57) goto LAB_002058f9;
          if (((bVar9) || (borg_create_door != false)) || (borg_fighting_unique != L'\0')) {
LAB_002058ea:
            wVar20 = pmVar13[uVar2].spell_power * 2;
          }
          else {
            wVar20 = pmVar13[uVar2].spell_power << 2;
          }
          goto LAB_002058f4;
        case '[':
          iVar36 = -1;
          do {
            lVar47 = -1;
            do {
              if (((int)lVar47 != 0 || iVar36 != 0) &&
                 (_Var14 = borg_feature_protected
                                     (borg_grids[(pbVar52->pos).y + lVar47] +
                                      (long)iVar36 + (long)(pbVar52->pos).x), _Var14)) {
                if (borg_morgoth_position == false) {
                  bVar55 = iVar48 == -1;
                  iVar23 = iVar48 + 1;
                  bVar56 = iVar48 != 7;
                  iVar48 = 100;
                  if (bVar56) {
                    iVar48 = iVar23 + (uint)bVar55;
                  }
                  if (borg_as_position != true) goto LAB_00204c81;
                }
                iVar48 = 1000;
              }
LAB_00204c81:
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 != 2);
            iVar36 = iVar36 + 1;
          } while (iVar36 != 2);
          if (!bVar57) goto LAB_002058f9;
          if ((bVar9) || (borg_create_door == true)) goto LAB_00205474;
          goto LAB_002058ea;
        }
        if ((bVar16) &&
           (_Var14 = borg_projectable_pure((pbVar52->pos).y,(pbVar52->pos).x,borg.c.y,borg.c.x),
           !_Var14)) {
          iVar36 = 0;
        }
        if (0x4a < borg.trait[0x6a]) {
          iVar23 = 0;
        }
        uVar35 = iVar23 + iVar36;
        if ((int)uVar34 < (int)uVar35) {
          uVar34 = uVar35;
        }
        iVar40 = iVar40 + uVar35;
        uVar54 = uVar54 + 1;
      } while (uVar54 < pbVar52->ranged_attack);
      uVar37 = 0;
      if (0 < iVar40 - borg.trait[0x2f]) {
        uVar37 = iVar40 - borg.trait[0x2f];
      }
      if ((borg_morgoth_position != false) || (borg_as_position == true)) {
        uVar37 = (uVar37 * 7) / 10;
      }
      uVar37 = uVar37 / pbVar52->ranged_attack;
      uVar35 = uVar37;
      if (((average) && (uVar35 = uVar34, (int)uVar34 < (int)((uVar37 * 0xf) / 10))) &&
         (uVar35 = uVar37, (borg.trait[0x1b] << 3) / 10 < (int)uVar34)) {
        uVar35 = uVar34;
      }
    }
  }
  if ((pmVar12[uVar31].freq_innate == L'\0') && (pmVar12[uVar31].freq_spell == L'\0')) {
    uVar35 = 0;
  }
  wVar20 = borg_distance(y_00,wVar24,y,x);
  uVar34 = 0;
  if (wVar20 <= (int)(uint)z_info->max_range) {
    uVar34 = uVar35;
  }
  if ((((int)uVar18 < 0xb) && (_Var14 = borg_projectable(y_00,wVar24,y,x), !_Var14)) &&
     (_Var14 = borg_projectable(y,x,y_00,wVar24), !_Var14)) {
    uVar34 = 0;
  }
  if (0x13 < (int)uVar26) {
    uVar18 = (int)(uVar34 * uVar26) / 10;
    lVar47 = 0;
    uVar34 = 0;
    do {
      pcVar11 = cave;
      lVar38 = (long)ddy_ddd[lVar47] + (long)y_00;
      lVar53 = (long)ddx_ddd[lVar47] + (long)wVar24;
      wVar49 = (wchar_t)lVar53;
      wVar20 = (wchar_t)lVar38;
      lVar25 = (loc)loc(wVar49,wVar20);
      _Var14 = square_in_bounds_fully(pcVar11,lVar25);
      if ((((_Var14) && (borg_grids[lVar38][lVar53].kill == '\0')) &&
          (bVar1 = borg_grids[lVar38][lVar53].feat, bVar1 != 2)) && (bVar1 != 0x16)) {
        if (0xf < bVar1) {
          _Var14 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
          if ((_Var14) && (_Var14 = borg_projectable(wVar20,wVar49,y,x), _Var14)) {
            uVar34 = uVar18;
          }
          _Var14 = flag_has_dbg(flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
          if (!_Var14) goto LAB_00206092;
        }
        _Var14 = borg_projectable(wVar20,wVar49,y,x);
        if (_Var14) {
          uVar34 = uVar18;
        }
      }
LAB_00206092:
      lVar47 = lVar47 + 1;
    } while (lVar47 != 8);
    uVar26 = 0x14;
  }
  uVar18 = uVar34;
  if (25000 < borg_t) {
    uVar18 = (int)uVar34 / 5;
  }
  if (0x4b0 < borg.time_this_panel) {
    uVar18 = (int)uVar34 / 5;
  }
  uVar54 = (ulong)uVar18;
  _Var14 = flag_has_dbg(flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
  if ((_Var14) && (borg.trait[0x23] < 0x14)) {
    uVar54 = (ulong)((int)(uVar18 * 0xc) / 10 + uVar18);
  }
  if (((pmVar12[uVar31].friends != (monster_friends *)0x0) ||
      (pmVar12[uVar31].friends_base != (monster_friends_base *)0x0)) && (borg.trait[0x23] < 0x14)) {
    uVar54 = (ulong)(uint)(((int)uVar54 * 0xc) / 10 + (int)uVar54);
  }
  if (pbVar50->awake == false) {
    iVar19 = (int)(uVar54 >> 0x1f) + (int)uVar54 >> 1;
    if (borg.trait[0x23] < 0x19) {
      iVar19 = (int)uVar54;
    }
    uVar54 = (ulong)(uint)(((pmVar12[uVar31].sleep + L'\x05') * iVar19) / 100 + iVar19);
  }
  if ((((uVar17 < 2 & borg_sleep_spell_ii & pbVar50->awake) == 1) &&
      (_Var14 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var14)) &&
     (_Var14 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var14)) {
    iVar19 = borg.trait[0x23];
    iVar27 = (iVar19 - 10U >> 2) * 3 + 10;
    if (iVar19 < 0xf) {
      iVar27 = iVar19;
    }
    if (pbVar50->level <= iVar27) {
      uVar54 = (ulong)(uint)((int)uVar54 / 3);
    }
  }
  if ((borg_crush_spell == true) &&
     (((int)pbVar50->injury * (int)pbVar50->power) / 100 < borg.trait[0x23] * 4)) {
    uVar54 = 0;
  }
  if (borg_sleep_spell == true) {
    uVar54 = (long)(int)uVar54 / (long)(int)(uVar45 + 2) & 0xffffffff;
  }
  iVar19 = (int)(uVar54 >> 0x1f) + (int)uVar54 >> 1;
  if (pbVar50->confused == false) {
    iVar19 = (int)uVar54;
  }
  if (pbVar50->stunned == true) {
    iVar19 = (iVar19 * 10) / 0xd;
  }
  if (borg_confuse_spell != false) {
    iVar19 = iVar19 / 6;
  }
  if (!full_damage) {
    iVar27 = pmVar12[uVar31].freq_spell + pmVar12[uVar31].freq_innate;
    if (iVar27 < 0x16) {
      iVar19 = iVar19 << 2;
    }
    else if (iVar27 < 0x34) {
      iVar19 = iVar19 * 6;
    }
    else {
      if (0x65 < iVar27) goto LAB_002063f6;
      iVar19 = iVar19 << 3;
    }
    iVar19 = iVar19 / 10;
  }
LAB_002063f6:
  if (iVar19 == 0) {
    wVar24 = L'\0';
  }
  else {
    wVar24 = (int)(iVar19 * uVar26) / 10;
  }
  if (wVar24 < wVar21) {
    wVar24 = wVar21;
  }
  if (L'ߏ' < wVar24) {
    wVar24 = L'ߐ';
  }
  return wVar24;
}

Assistant:

int borg_danger_one_kill(
    int y, int x, int c, int i, bool average, bool full_damage)
{
    borg_kill *kill            = &borg_kills[i];

    struct monster_race *r_ptr = &r_info[kill->r_idx];

    int x9                     = kill->pos.x;
    int y9                     = kill->pos.y;
    int y_temp, x_temp;

    int ax, ay, d;

    int q = 0, r, p, v1 = 0, v2 = 0, b_v2 = 0, b_v1 = 0;

    int fake_speed    = borg.trait[BI_SPEED];
    int monster_speed = kill->speed;
    int t, e;

    int ii;
    int chance;

    /* Paranoia */
    if (!kill->r_idx)
        return 0;

    /* "player ghosts" */
    if (kill->r_idx >= z_info->r_max - 1)
        return 100;

    /* Skip certain monster indexes.
     * These have been listed mainly in Teleport Other
     * checks in borg6.c in the defense maneuvers.
     */
    if (borg_tp_other_n) {
        for (ii = 0; ii <= borg_tp_other_n; ii++) {
            /* Is the current danger check same as a saved monster index? */
            if (i == borg_tp_other_index[ii]) {
                return 0;
            }
        }
    }

    /* Distance components */
    ax = (x9 > x) ? (x9 - x) : (x - x9);
    ay = (y9 > y) ? (y9 - y) : (y - y9);

    /* Distance */
    d = MAX(ax, ay);

    /* Minimal distance */
    if (d < 1)
        d = 1;

    /* Minimal distance */
    if (d > 20)
        return 0;

    /* A very speedy borg will miscalculate danger of some monsters */
    if (borg.trait[BI_SPEED] >= 135)
        fake_speed = (borg_fighting_unique ? 120 : 125);

    /* Consider the character haste and slow monster spells */
    if (borg.temp.fast)
        fake_speed += 10;
    if (borg_slow_spell)
        monster_speed -= 10;

    /* Assume monsters are a little fast when you are low level */
    if (borg.trait[BI_MAXHP] < 20 && borg.trait[BI_CDEPTH])
        monster_speed += 3;

    /* Player energy per game turn  */
    e = extract_energy[(fake_speed)];

    /* Game turns per player move  */
    t = (100 + (e - 1)) / e;

    /*  Monster energy per game turn  */
    e = extract_energy[monster_speed];

    /* Monster moves */
    q = c * ((t * e) / 10);

    /* allow partial hits when not calculating full possible damage */
    if (full_damage)
        q = (int)((q + 9) / 10) * 10;

    /* Minimal energy.  Monsters get at least some energy.
     * If the borg is very fast relative to a monster, then the
     * monster danger is artificially low due to the way the borg
     * will calculate the danger and energy.  So the monsters must
     * be given some base energy to equate the borg's.
     * ie:  the borg with speed +40 (speed = 150) is attacking
     * a monster with normal speed (speed = 110).  One would
     * think that the borg gets 4 attacks per turn over the monster.
     * and this does happen.  What if the monster can deal out
     * 1000 damage pts per monster attack turn?  The borg will
     * reduce the danger to 250 because the borg is 4x faster
     * than the monster.  But eventually the borg will get hit
     * by that 1000 pt damage attack.  And when it does, its
     * going to hurt.
     * So we make sure the monster is at least as fast as us.
     * But the monster is allowed to be faster than us.
     */
    if (q <= 10)
        q = 10;

    /** Danger from physical attacks **/

    /* Physical attacks */
    v1 = borg_danger_physical(i, full_damage);

    /* Hack -- Under Stressful Situation.
     */
    if (borg.time_this_panel > 1200 || borg_t > 25000) {
        /* he might be stuck and could overflow */
        v1 = v1 / 5;
    }

    /* No attacks for some monsters */
    if (rf_has(r_ptr->flags, RF_NEVER_BLOW)) {
        v1 = 0;
    }

    /* No movement for some monsters */
    if ((rf_has(r_ptr->flags, RF_NEVER_MOVE)) && (d > 1)) {
        v1 = 0;
    }

    /* multipliers yeild some trouble when I am weak */
    if ((rf_has(r_ptr->flags, RF_MULTIPLY))
        && (borg.trait[BI_CLEVEL] < 20)) { /* extra 50% */
        v1 = v1 + (v1 * 15 / 10);
    }

    /* Friends yeild some trouble when I am weak */
    if ((r_ptr->friends || r_ptr->friends_base)
        && (borg.trait[BI_CLEVEL] < 20)) {
        if (borg.trait[BI_CLEVEL] < 15) {
            /* extra 80% */
            v1 = v1 + (v1 * 18 / 10);
        } else {
            /* extra 30% */
            v1 = v1 + (v1 * 13 / 10);
        }
    }

    /* Reduce danger from sleeping monsters */
    if (!kill->awake) {
        int inc = r_ptr->sleep + 5;
        /* Reduce the fear if Borg is higher level */
        if (borg.trait[BI_CLEVEL] >= 25) {
            v1 = v1 / 2;
        }

        /* Tweak danger based on the "alertness" of the monster */
        /* increase the danger for light sleepers */
        v1 = v1 + (v1 * inc / 100);
    }
    /* Reduce danger from sleeping monsters with the sleep 2 spell*/
    if (borg_sleep_spell_ii) {
        if ((d == 1) && (kill->awake) && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / 3;
            }
        }
    }
    /* Reduce danger from sleeping monsters with the sleep 1,3 spell*/
    if (borg_sleep_spell) {
        if (kill->awake && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / (d + 2);
            }
        }
    }
    if (borg_crush_spell) {
        /* HACK for now, either it dies or it doesn't.  */
        /* If we discover it isn't using this spell much, we can modify */
        if ((kill->power * kill->injury) / 100 < borg.trait[BI_CLEVEL] * 4)
            v1 = 0;
    }

    /* Reduce danger from confused monsters */
    if (kill->confused) {
        v1 = v1 / 2;
    }
    if (kill->stunned) {
        v1 = v1 * 10 / 13;
    }
    if (borg_confuse_spell) {
        if (kill->awake && !kill->confused
            && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / (d + 2);
            }
        }
    }
    /* Perceive a reduce danger from scared monsters */
    if (borg_fear_mon_spell) {
        v1 = 0;
    }

    /* Hack -- Physical attacks require proximity
     *
     * Note that we do try to consider a fast monster moving and attacking
     * in the same round.  We should consider monsters that have a speed 2 or 3
     * classes higher than ours, but most times, the borg will only encounter
     * monsters with a single category higher speed.
     */
    if (q > 10 && d != 1 && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))) {
        b_v1 = 0;

        /* Check for a single grid movement, simulating the monster's move
         * action. */
        for (ii = 0; ii < 8; ii++) {
            /* Obtain a grid to which the monster might move */
            y_temp = y9 + ddy_ddd[ii];
            x_temp = x9 + ddx_ddd[ii];

            /* Check for legality */
            if (!square_in_bounds_fully(cave, loc(x_temp, y_temp)))
                continue;

            /* Cannot occupy another monster's grid */
            if (borg_grids[y_temp][x_temp].kill)
                continue;

            /* Cannot occupy a closed door */
            if (borg_grids[y_temp][x_temp].feat == FEAT_CLOSED)
                continue;

            /* Cannot occupy a perma-wall */
            if (borg_grids[y_temp][x_temp].feat == FEAT_PERM)
                continue;

            /* Cannot occupy a wall/seam grid (unless pass_wall or kill_wall) */
            if (borg_grids[y_temp][x_temp].feat == FEAT_GRANITE
                || (borg_grids[y_temp][x_temp].feat == FEAT_MAGMA
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ
                    || borg_grids[y_temp][x_temp].feat == FEAT_MAGMA_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_RUBBLE)) {
                /* legally on a wall of some sort, check for closeness*/
                if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
                    if (borg_distance(y_temp, x_temp, y, x) == 1)
                        b_v1 = v1;
                }
                if (rf_has(r_ptr->flags, RF_KILL_WALL)) {
                    if (borg_distance(y_temp, x_temp, y, x) == 1)
                        b_v1 = v1;
                }
            }

            /* Is this grid being considered adjacent to the grid for which the
             * borg_danger() was called? */
            if (borg_distance(y_temp, x_temp, y, x) > 1)
                continue;

            /* A legal floor grid */
            if (borg_cave_floor_bold(y_temp, x_temp)) {
                /* Really fast monster can hit me more than once after it's move
                 */
                b_v1 = v1 * (q / (d * 10));
            }
        }

        /* Monster is not able to move and threaten me in the same round */
        v1 = b_v1;
    }

    /* Consider a monster that is fast and can strike more than once per round
     */
    if (q > 10 && d == 1) {
        v1 = v1 * q / 10;
    }

    /* Need to be close if you are normal speed */
    if (q == 10 && d > 1) {
        v1 = 0;
    }

    /** Ranged Attacks **/
    v2 = borg_danger_spell(i, y, x, d, average, full_damage);

    /* Never cast spells */
    if (!r_ptr->freq_innate && !r_ptr->freq_spell) {
        v2 = 0;
    }

    /* Hack -- verify distance */
    if (borg_distance(y9, x9, y, x) > z_info->max_range) {
        v2 = 0;
    }

    /* Hack -- verify line of sight (both ways) for monsters who can only move 1
     * grid. */
    if (q <= 10 && !borg_projectable(y9, x9, y, x)
        && !borg_projectable(y, x, y9, x9)) {
        v2 = 0;
    }

    /* Hack -- verify line of sight (both ways) for monsters who can only move >
     *1 grid. Some fast monsters can take a move action and range attack in the
     *same round. Basically, we see how many grids the monster can move and
     *check LOS from each of those grids to determine the relative danger.  We
     *need to make sure that the monster is not passing through walls unless he
     *has that ability. Consider a fast monster who can move and cast a spell in
     *the same round. This is important for a borg looking for a safe grid from
     *a ranged attacker. If the attacker is fast then he might be able to move
     *to a grid which does have LOS to the grid the borg is considering.
     *
     * ##############
     * #.....#.#.1#D#   Grids marked 2 are threatened by the D currently.
     * #####.#..##@##	Grids marked 1 are safe currently, but the fast D will
     *be able
     * #####.#..1221#	to move to the borg's grid after he moves and the D will
     *be able
     * ##############	to use a ranged attack to grids 1, all in the same
     *round. The borg should not consider grid 1 as safe.
     */
    if (q >= 20) {
        int b_q = q;
        b_v2    = 0;

        /* Maximal speed check */
        if (q > 20)
            q = 20;

        /* Check for a single grid movement, simulating the monster's move
         * action. */
        for (ii = 0; ii < 8; ii++) {
            /* Obtain a grid to which the monster might move */
            y_temp = y9 + ddy_ddd[ii];
            x_temp = x9 + ddx_ddd[ii];

            /* Check for legality */
            if (!square_in_bounds_fully(cave, loc(x_temp, y_temp)))
                continue;

            /* Cannot occupy another monster's grid */
            if (borg_grids[y_temp][x_temp].kill)
                continue;

            /* Cannot occupy a closed door */
            if (borg_grids[y_temp][x_temp].feat == FEAT_CLOSED)
                continue;

            /* Cannot occupy a perma-wall */
            if (borg_grids[y_temp][x_temp].feat == FEAT_PERM)
                continue;

            /* Cannot occupy a wall/seam grid (unless pass_wall or kill_wall) */
            if (borg_grids[y_temp][x_temp].feat >= FEAT_GRANITE
                || (borg_grids[y_temp][x_temp].feat == FEAT_MAGMA
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ
                    || borg_grids[y_temp][x_temp].feat == FEAT_MAGMA_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_RUBBLE)) {
                /* legally on a wall of some sort, check for LOS*/
                if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
                    if (borg_projectable(y_temp, x_temp, y, x))
                        b_v2 = v2 * b_q / 10;
                }
                if (rf_has(r_ptr->flags, RF_KILL_WALL)) {
                    if (borg_projectable(y_temp, x_temp, y, x))
                        b_v2 = v2 * b_q / 10;
                }
            }

            /* Monster on a legal floor grid.  Can he see me? */
            else if (borg_projectable(y_temp, x_temp, y, x))
                b_v2 = v2 * b_q / 10;
        }

        /* Monster is not able to move and threaten me in the same round */
        v2 = b_v2;
    }

    /* Hack -- Under Stressful Situation.
     */
    if (borg.time_this_panel > 1200 || borg_t > 25000) {
        /* he might be stuck and could overflow */
        v2 = v2 / 5;
    }

    /* multipliers yield some trouble when I am weak */
    if ((rf_has(r_ptr->flags, RF_MULTIPLY)) && (borg.trait[BI_CLEVEL] < 20)) {
        v2 = v2 + (v2 * 12 / 10);
    }

    /* Friends yield some trouble when I am weak */
    if ((r_ptr->friends || r_ptr->friends_base)
        && (borg.trait[BI_CLEVEL] < 20)) {
        v2 = v2 + (v2 * 12 / 10);
    }

    /* Reduce danger from sleeping monsters */
    if (!kill->awake) {
        int inc = r_ptr->sleep + 5;
        /* weaklings and should still fear */
        if (borg.trait[BI_CLEVEL] >= 25) {
            v2 = v2 / 2;
        }

        /* Tweak danger based on the "alertness" of the monster */
        /* increase the danger for light sleepers */
        v2 = v2 + (v2 * inc / 100);
    }

    /* Reduce danger from sleeping monsters with the sleep 2 spell*/
    if (borg_sleep_spell_ii) {

        if ((d == 1) && (kill->awake) && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level
                <= ((borg.trait[BI_CLEVEL] < 15)
                        ? borg.trait[BI_CLEVEL]
                        : (((borg.trait[BI_CLEVEL] - 10) / 4) * 3) + 10))) {
            v2 = v2 / 3;
        }
    }

    if (borg_crush_spell) {
        /* HACK for now, either it dies or it doesn't.  */
        /* If we discover it isn't using this spell much, we can modify */
        if ((kill->power * kill->injury) / 100 < borg.trait[BI_CLEVEL] * 4)
            v2 = 0;
    }

    /* Reduce danger from sleeping monsters with the sleep 1,3 spell*/
    if (borg_sleep_spell) {
        v2 = v2 / (d + 2);
    }
    /* Reduce danger from confused monsters */
    if (kill->confused) {
        v2 = v2 / 2;
    }
    /* Reduce danger from stunned monsters  */
    if (kill->stunned) {
        v2 = v2 * 10 / 13;
    }
    if (borg_confuse_spell) {
        v2 = v2 / 6;
    }

#if 0 /* They still cast spells, they are still dangerous */
    /* Reduce danger from scared monsters */
    if (borg_fear_mon_spell) {
        v2 = v2 * 8 / 10;
    }
    if (kill->afraid) {
        v2 = v2 * 8 / 10;
    }
#endif
    if (!full_damage) {
        /* reduce for frequency. */
        chance = (r_ptr->freq_innate + r_ptr->freq_spell) / 2;
        if (chance < 11)
            v2 = ((v2 * 4) / 10);
        else if (chance < 26)
            v2 = ((v2 * 6) / 10);
        else if (chance < 51)
            v2 = ((v2 * 8) / 10);
    }

    /* Danger */
    if (v2) {
        /* Full power */
        r = q;

        /* Total danger */
        v2 = v2 * r / 10;
    }

    /* Maximal danger */
    p = MAX(v1, v2);
    if (p > 2000)
        p = 2000;

    /* Result */
    return (p);
}